

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O0

void __thiscall getarg_tests::patharg::test_method(patharg *this)

{
  long lVar1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar2;
  string *strArg;
  long in_FS_OFFSET;
  pair<const_char_*,_ArgsManager::Flags> pVar3;
  char *in_stack_ffffffffffffde98;
  lazy_ostream *in_stack_ffffffffffffdea0;
  char *in_stack_ffffffffffffdea8;
  char (*in_stack_ffffffffffffdeb0) [5];
  const_string *in_stack_ffffffffffffdec0;
  pair<const_char_*,_ArgsManager::Flags> *in_stack_ffffffffffffdec8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_ffffffffffffded0;
  allocator<char> *in_stack_ffffffffffffded8;
  ArgsManager *in_stack_ffffffffffffdee0;
  undefined7 in_stack_ffffffffffffdee8;
  undefined1 in_stack_ffffffffffffdeef;
  string *in_stack_ffffffffffffdf20;
  ArgsManager *in_stack_ffffffffffffdf28;
  ArgsManager *pAVar4;
  ArgsManager *local_1c48;
  patharg *this_local;
  allocator<char> local_1bd1;
  undefined1 local_1bd0 [16];
  undefined1 local_1bc0 [70];
  allocator<char> local_1b7a;
  allocator<char> local_1b79;
  undefined1 local_1b78 [16];
  undefined1 local_1b68 [70];
  allocator<char> local_1b22;
  allocator<char> local_1b21;
  undefined1 local_1b20 [16];
  undefined1 local_1b10 [70];
  allocator<char> local_1aca;
  allocator<char> local_1ac9;
  undefined1 local_1ac8 [16];
  undefined1 local_1ab8 [70];
  allocator<char> local_1a72;
  allocator<char> local_1a71;
  undefined1 local_1a70 [16];
  undefined1 local_1a60 [70];
  allocator<char> local_1a1a;
  allocator<char> local_1a19;
  undefined1 local_1a18 [16];
  undefined1 local_1a08 [70];
  allocator<char> local_19c2;
  allocator<char> local_19c1;
  undefined1 local_19c0 [16];
  undefined1 local_19b0 [70];
  allocator<char> local_196a;
  allocator<char> local_1969;
  undefined1 local_1968 [16];
  undefined1 local_1958 [70];
  allocator<char> local_1912;
  allocator<char> local_1911;
  undefined1 local_1910 [16];
  undefined1 local_1900 [70];
  allocator<char> local_18ba;
  allocator<char> local_18b9;
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [70];
  allocator<char> local_1862;
  allocator<char> local_1861;
  undefined1 local_1860 [16];
  undefined1 local_1850 [70];
  allocator<char> local_180a;
  allocator<char> local_1809;
  undefined1 local_1808 [16];
  undefined1 local_17f8 [70];
  allocator<char> local_17b2;
  allocator<char> local_17b1;
  undefined1 local_17b0 [16];
  undefined1 local_17a0 [70];
  allocator<char> local_175a;
  allocator<char> local_1759;
  undefined1 local_1758 [16];
  undefined1 local_1748 [70];
  allocator<char> local_1702;
  allocator<char> local_1701;
  undefined1 local_1700 [16];
  undefined1 local_16f0 [70];
  allocator<char> local_16aa;
  allocator<char> local_16a9;
  undefined1 local_16a8 [16];
  undefined1 local_1698 [70];
  allocator<char> local_1652;
  allocator<char> local_1651;
  undefined1 local_1650 [16];
  undefined1 local_1640 [70];
  allocator<char> local_15fa;
  allocator<char> local_15f9;
  undefined1 local_15f8 [16];
  undefined1 local_15e8 [70];
  allocator<char> local_15a2;
  allocator<char> local_15a1;
  undefined1 local_15a0 [16];
  undefined1 local_1590 [70];
  allocator<char> local_154a;
  allocator<char> local_1549;
  undefined1 local_1548 [16];
  undefined1 local_1538 [70];
  allocator<char> local_14f2;
  allocator<char> local_14f1;
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [70];
  allocator<char> local_149a;
  allocator<char> local_1499;
  undefined1 local_1498 [16];
  undefined1 local_1488 [70];
  allocator<char> local_1442;
  allocator<char> local_1441;
  undefined1 local_1440 [16];
  undefined1 local_1430 [70];
  allocator<char> local_13ea;
  allocator<char> local_13e9;
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [70];
  allocator<char> local_1392;
  allocator<char> local_1391;
  undefined1 local_1390 [16];
  undefined1 local_1380 [70];
  allocator<char> local_133a;
  allocator<char> local_1339;
  undefined1 local_1338 [16];
  undefined1 local_1328 [70];
  allocator<char> local_12e2 [26];
  char *local_12c8;
  Flags local_12c0;
  undefined4 local_12b4;
  pair<const_char_*,_ArgsManager::Flags> dir;
  lazy_ostream local_12a0 [7];
  undefined1 local_1230 [72];
  lazy_ostream local_11e8 [7];
  undefined1 local_1178 [72];
  lazy_ostream local_1130 [7];
  undefined1 local_10c0 [72];
  lazy_ostream local_1078 [7];
  undefined1 local_1008 [8];
  undefined8 local_1000;
  lazy_ostream local_fc0 [7];
  undefined1 local_f50 [72];
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined1 local_ec0 [72];
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined1 local_e30 [72];
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined1 local_da0 [72];
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined1 local_d10 [72];
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined1 local_c80 [72];
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined1 local_bf0 [72];
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined1 local_b60 [72];
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined1 local_ac8 [72];
  path relative_path;
  undefined1 local_a10 [72];
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined1 local_980 [72];
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined1 local_8f0 [72];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined1 local_860 [72];
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined1 local_7d0 [72];
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined1 local_740 [72];
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined1 local_6b0 [72];
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined1 local_618 [72];
  path absolute_path;
  undefined1 local_560 [72];
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined1 local_4d0 [72];
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined1 local_440 [72];
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined1 local_3a8 [72];
  path root_path;
  lazy_ostream local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined1 local_2c0 [72];
  undefined1 local_278 [40];
  ArgsManager local_args;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager((ArgsManager *)in_stack_ffffffffffffde98);
  local_12b4 = 1;
  pVar3 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                    (in_stack_ffffffffffffdeb0,(Flags *)in_stack_ffffffffffffdea8);
  local_12c8 = pVar3.first;
  local_12c0 = pVar3.second;
  dir.first = local_12c8;
  dir.second = local_12c0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffffded0,in_stack_ffffffffffffdec8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_ffffffffffffde98);
  __l._M_len._0_7_ = in_stack_ffffffffffffdee8;
  __l._M_array = (iterator)in_stack_ffffffffffffdee0;
  __l._M_len._7_1_ = in_stack_ffffffffffffdeef;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffded8,__l,(allocator_type *)in_stack_ffffffffffffded0);
  SetupArgs(in_stack_ffffffffffffdee0,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffded8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffdea8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_ffffffffffffde98);
  local_1c48 = &local_args;
  do {
    local_1c48 = (ArgsManager *)&local_1c48[-1].m_cached_network_datadir_path;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_ffffffffffffde98);
  } while (local_1c48 != (ArgsManager *)local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(local_12e2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_2f8 = 0;
    uStack_2f0 = 0;
    local_308 = 0;
    uStack_300 = 0;
    local_2e8 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    local_328 = 0;
    uStack_320 = 0;
    local_338._vptr_lazy_ostream = (_func_int **)0x0;
    local_338.m_empty = false;
    local_338._9_7_ = 0;
    local_318 = 0;
    in_stack_ffffffffffffdea0 = &local_338;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    in_stack_ffffffffffffdea8 = "fs::path{}";
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1328,local_1338,0x117,1,2,local_2c0);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1339);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  fs::path::path((path *)0x68ef84,in_stack_ffffffffffffde98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_133a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_3e8 = 0;
    uStack_3e0 = 0;
    local_3f8 = 0;
    uStack_3f0 = 0;
    local_3d8 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "root_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&root_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1380,local_1390,0x11b,1,2,local_3a8);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1391);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1392);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_478 = 0;
    uStack_470 = 0;
    local_488 = 0;
    uStack_480 = 0;
    local_468 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "root_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&root_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_13d8,local_13e8,0x11e,1,2,local_440);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_13e9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_13ea);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_508 = 0;
    uStack_500 = 0;
    local_518 = 0;
    uStack_510 = 0;
    local_4f8 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "root_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&root_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1430,local_1440,0x121,1,2,local_4d0);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1441);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1442);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "root_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&root_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1488,local_1498,0x124,1,2,local_560);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1499);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  fs::path::path((path *)0x68f8c2,in_stack_ffffffffffffde98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_149a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_658 = 0;
    uStack_650 = 0;
    local_668 = 0;
    uStack_660 = 0;
    local_648 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "absolute_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&absolute_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_14e0,local_14f0,0x13d,1,2,local_618);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_14f1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_14f2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_6e8 = 0;
    uStack_6e0 = 0;
    local_6f8 = 0;
    uStack_6f0 = 0;
    local_6d8 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "absolute_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&absolute_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1538,local_1548,0x140,1,2,local_6b0);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1549);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_154a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_778 = 0;
    uStack_770 = 0;
    local_788 = 0;
    uStack_780 = 0;
    local_768 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "absolute_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&absolute_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1590,local_15a0,0x143,1,2,local_740);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_15a1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_15a2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_808 = 0;
    uStack_800 = 0;
    local_818 = 0;
    uStack_810 = 0;
    local_7f8 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "absolute_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&absolute_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_15e8,local_15f8,0x146,1,2,local_7d0);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_15f9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_15fa);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_898 = 0;
    uStack_890 = 0;
    local_8a8 = 0;
    uStack_8a0 = 0;
    local_888 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "absolute_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&absolute_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1640,local_1650,0x149,1,2,local_860);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1651);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1652);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_928 = 0;
    uStack_920 = 0;
    local_938 = 0;
    uStack_930 = 0;
    local_918 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "absolute_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&absolute_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1698,local_16a8,0x14c,1,2,local_8f0);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_16a9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_16aa);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_9b8 = 0;
    uStack_9b0 = 0;
    local_9c8 = 0;
    uStack_9c0 = 0;
    local_9a8 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "absolute_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&absolute_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_16f0,local_1700,0x14f,1,2,local_980);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1701);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1702);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "absolute_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&absolute_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1748,local_1758,0x152,1,2,local_a10);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1759);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  fs::path::path((path *)0x690b28,in_stack_ffffffffffffde98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_175a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_b08 = 0;
    uStack_b00 = 0;
    local_b18 = 0;
    uStack_b10 = 0;
    local_af8 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "relative_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&relative_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_17a0,local_17b0,0x156,1,2,local_ac8);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_17b1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_17b2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_b98 = 0;
    uStack_b90 = 0;
    local_ba8 = 0;
    uStack_ba0 = 0;
    local_b88 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "relative_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&relative_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_17f8,local_1808,0x159,1,2,local_b60);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1809);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_180a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_c28 = 0;
    uStack_c20 = 0;
    local_c38 = 0;
    uStack_c30 = 0;
    local_c18 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "relative_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&relative_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1850,local_1860,0x15c,1,2,local_bf0);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1861);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1862);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_cb8 = 0;
    uStack_cb0 = 0;
    local_cc8 = 0;
    uStack_cc0 = 0;
    local_ca8 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "relative_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&relative_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_18a8,local_18b8,0x15f,1,2,local_c80);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_18b9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_18ba);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_d48 = 0;
    uStack_d40 = 0;
    local_d58 = 0;
    uStack_d50 = 0;
    local_d38 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "relative_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&relative_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1900,local_1910,0x162,1,2,local_d10);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1911);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1912);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_dd8 = 0;
    uStack_dd0 = 0;
    local_de8 = 0;
    uStack_de0 = 0;
    local_dc8 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "relative_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&relative_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1958,local_1968,0x165,1,2,local_da0);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1969);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_196a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_e68 = 0;
    uStack_e60 = 0;
    local_e78 = 0;
    uStack_e70 = 0;
    local_e58 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "relative_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&relative_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_19b0,local_19c0,0x168,1,2,local_e30);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_19c1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_19c2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    local_ef8 = 0;
    uStack_ef0 = 0;
    local_f08 = 0;
    uStack_f00 = 0;
    local_ee8 = 0;
    fs::path::path((path *)in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    in_stack_ffffffffffffdea8 = "relative_path";
    in_stack_ffffffffffffdea0 = (lazy_ostream *)&relative_path;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1a08,local_1a18,0x16b,1,2,local_ec0);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1a19);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1a1a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    fs::path::path((path *)0x691eca,in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    fs::path::path((path *)0x691f07,in_stack_ffffffffffffde98);
    in_stack_ffffffffffffdea8 = "fs::path{\"default\"}";
    in_stack_ffffffffffffdea0 = local_fc0;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1a60,local_1a70,0x175,1,2,local_f50);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1a71);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1a72);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    fs::path::path((path *)0x692119,in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    fs::path::path((path *)0x692156,in_stack_ffffffffffffde98);
    in_stack_ffffffffffffdea8 = "fs::path{\"override\"}";
    in_stack_ffffffffffffdea0 = local_1078;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1ab8,local_1ac8,0x177,1,2,local_1008);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1ac9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1aca);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    fs::path::path((path *)0x692368,in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    fs::path::path((path *)0x6923a5,in_stack_ffffffffffffde98);
    in_stack_ffffffffffffdea8 = "fs::path{\"default\"}";
    in_stack_ffffffffffffdea0 = local_1130;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1b10,local_1b20,0x179,1,2,local_10c0);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1b21);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1b22);
  do {
    pAVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    strArg = (string *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    fs::path::path((path *)0x6925b7,in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    fs::path::path((path *)0x6925f4,in_stack_ffffffffffffde98);
    in_stack_ffffffffffffdea8 = "fs::path{\"default\"}";
    in_stack_ffffffffffffdea0 = local_11e8;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1b68,local_1b78,0x17b,1,2,local_1178);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1b79);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
             (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
  ResetArgs(pAVar4,strArg);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffde98);
  std::allocator<char>::~allocator(&local_1b7a);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffded8,
               (const_string *)in_stack_ffffffffffffded0,(size_t)in_stack_ffffffffffffdec8,
               in_stack_ffffffffffffdec0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdea0,(char (*) [1])in_stack_ffffffffffffde98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdea8,
               (pointer)in_stack_ffffffffffffdea0,(unsigned_long)in_stack_ffffffffffffde98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (char *)in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    fs::path::path((path *)0x6927e8,in_stack_ffffffffffffde98);
    ArgsManager::GetPathArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
               (string *)in_stack_ffffffffffffdee0,(path *)in_stack_ffffffffffffded8);
    fs::path::path((path *)0x692825,in_stack_ffffffffffffde98);
    in_stack_ffffffffffffdea8 = "fs::path{\"\"}";
    in_stack_ffffffffffffdea0 = local_12a0;
    in_stack_ffffffffffffde98 = "local_args.GetPathArg(\"-dir\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
              (local_1bc0,local_1bd0,0x17d,1,2,local_1230);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    fs::path::~path((path *)in_stack_ffffffffffffde98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffde98);
    std::allocator<char>::~allocator(&local_1bd1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde98);
    in_stack_ffffffffffffdeef = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffdeef);
  fs::path::~path((path *)in_stack_ffffffffffffde98);
  fs::path::~path((path *)in_stack_ffffffffffffde98);
  fs::path::~path((path *)in_stack_ffffffffffffde98);
  ArgsManager::~ArgsManager((ArgsManager *)in_stack_ffffffffffffde98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(patharg)
{
    ArgsManager local_args;

    const auto dir = std::make_pair("-dir", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {dir});
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), fs::path{});

    const fs::path root_path{"/"};
    ResetArgs(local_args, "-dir=/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

    ResetArgs(local_args, "-dir=/.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

    ResetArgs(local_args, "-dir=/./");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

    ResetArgs(local_args, "-dir=/.//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

#ifdef WIN32
    const fs::path win_root_path{"C:\\"};
    ResetArgs(local_args, "-dir=C:\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\.\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\.\\\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);
#endif

    const fs::path absolute_path{"/home/user/.bitcoin"};
    ResetArgs(local_args, "-dir=/home/user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/root/../home/user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/./user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/./");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/.//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    const fs::path relative_path{"user/.bitcoin"};
    ResetArgs(local_args, "-dir=user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=somewhere/../user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/./.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/./");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/.//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    // Check negated and default argument handling. Specifying an empty argument
    // is the same as not specifying the argument. This is convenient for
    // scripting so later command line arguments can override earlier command
    // line arguments or bitcoin.conf values. Currently the -dir= case cannot be
    // distinguished from -dir case with no assignment, but #16545 would add the
    // ability to distinguish these in the future (and treat the no-assign case
    // like an imperative command or an error).
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"default"});
    ResetArgs(local_args, "-dir=override");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"override"});
    ResetArgs(local_args, "-dir=");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"default"});
    ResetArgs(local_args, "-dir");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"default"});
    ResetArgs(local_args, "-nodir");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{""});
}